

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O3

stmm_table *
stmm_init_table_with_params
          (stmm_compare_func_type compare,stmm_hash_func_type hash,int size,int density,
          double grow_factor,int reorder_flag)

{
  stmm_table *__ptr;
  stmm_table_entry **ppsVar1;
  Extra_MmFixed_t *pEVar2;
  ulong uVar3;
  
  __ptr = (stmm_table *)malloc(0x38);
  if (__ptr != (stmm_table *)0x0) {
    __ptr->compare = compare;
    __ptr->hash = hash;
    __ptr->num_entries = 0;
    __ptr->max_density = density;
    __ptr->grow_factor = grow_factor;
    __ptr->reorder_flag = reorder_flag;
    uVar3 = 1;
    if (1 < size) {
      uVar3 = (ulong)(uint)size;
    }
    __ptr->num_bins = (int)uVar3;
    ppsVar1 = (stmm_table_entry **)calloc(1,uVar3 << 3);
    __ptr->bins = ppsVar1;
    if (ppsVar1 != (stmm_table_entry **)0x0) {
      pEVar2 = Extra_MmFixedStart(0x18);
      __ptr->pMemMan = pEVar2;
      return __ptr;
    }
    free(__ptr);
  }
  return (stmm_table *)0x0;
}

Assistant:

stmm_table *
stmm_init_table_with_params (stmm_compare_func_type compare, stmm_hash_func_type hash, int size, int density, double grow_factor, int reorder_flag)
{
    int i;
    stmm_table *newTable;

    newTable = ABC_ALLOC(stmm_table, 1);
    if (newTable == NULL) {
    return NULL;
    }
    newTable->compare = compare;
    newTable->hash = hash;
    newTable->num_entries = 0;
    newTable->max_density = density;
    newTable->grow_factor = grow_factor;
    newTable->reorder_flag = reorder_flag;
    if (size <= 0) {
    size = 1;
    }
    newTable->num_bins = size;
    newTable->bins = ABC_ALLOC(stmm_table_entry *, size);
    if (newTable->bins == NULL) {
    ABC_FREE(newTable);
    return NULL;
    }
    for (i = 0; i < size; i++) {
    newTable->bins[i] = 0;
    }

    // added by alanmi
    newTable->pMemMan = Extra_MmFixedStart(sizeof (stmm_table_entry));
    return newTable;
}